

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O1

Sphere * __thiscall SceneParser::parseSphere(SceneParser *this)

{
  Material *material;
  Sphere *this_00;
  float radius;
  Vector3f center;
  char token [100];
  short local_78;
  undefined1 uStack_76;
  undefined1 uStack_75;
  
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (local_78 != 0x7b) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x144,"Sphere *SceneParser::parseSphere()");
  }
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (_uStack_75 != 0x726574 || CONCAT13(uStack_75,CONCAT12(uStack_76,local_78)) != 0x746e6563) {
    __assert_fail("!strcmp(token, \"center\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x146,"Sphere *SceneParser::parseSphere()");
  }
  readVector3f((SceneParser *)&stack0xffffffffffffff7c);
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (_uStack_75 != 0x737569 || CONCAT13(uStack_75,CONCAT12(uStack_76,local_78)) != 0x69646172) {
    __assert_fail("!strcmp(token, \"radius\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x149,"Sphere *SceneParser::parseSphere()");
  }
  radius = readFloat(this);
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (local_78 == 0x7d) {
    material = this->_current_material;
    if (material != (Material *)0x0) {
      this_00 = (Sphere *)operator_new(0x40);
      Sphere::Sphere(this_00,(Vector3f *)&stack0xffffffffffffff7c,radius,material);
      return this_00;
    }
    __assert_fail("_current_material != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x14d,"Sphere *SceneParser::parseSphere()");
  }
  __assert_fail("!strcmp(token, \"}\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x14c,"Sphere *SceneParser::parseSphere()");
}

Assistant:

Sphere *
SceneParser::parseSphere() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "center"));
    Vector3f center = readVector3f();
    getToken(token);
    assert(!strcmp(token, "radius"));
    float radius = readFloat();
    getToken(token);
    assert(!strcmp(token, "}"));
    assert(_current_material != NULL);
    return new Sphere(center, radius, _current_material);
}